

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartialPiece
          (MessageBuilderGenerator *this,Printer *printer,int piece,int first_field)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  ImmutableFieldGenerator *pIVar5;
  size_type sVar6;
  uint *puVar7;
  int index;
  int index_00;
  int index_01;
  AlphaNum *a;
  int iVar8;
  iterator iVar9;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  int to_bitfield;
  undefined4 uStack_c4;
  int local_c0;
  btree_set<int,_std::less<int>,_std::allocator<int>_> declared_to_bitfields;
  AlphaNum local_80;
  string local_50;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&declared_to_bitfields,this->name_resolver_,this->descriptor_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_80,piece);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)&to_bitfield,(lts_20250127 *)&local_80,a);
  GetBitFieldName_abi_cxx11_(&local_50,(java *)(ulong)(uint)piece,index);
  text._M_str = 
  "private void buildPartial$piece$($classname$ result) {\n  int from_$bit_field_name$ = $bit_field_name$;\n"
  ;
  text._M_len = 0x67;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[15],std::__cxx11::string>
            (printer,text,(char (*) [10])0x475c54,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &declared_to_bitfields,(char (*) [6])"piece",(string *)&to_bitfield,
             (char (*) [15])"bit_field_name",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&to_bitfield);
  std::__cxx11::string::~string((string *)&declared_to_bitfields);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  declared_to_bitfields.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::EmptyNode()::empty_node;
  declared_to_bitfields.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             ::EmptyNode()::empty_node;
  declared_to_bitfields.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.size_ = 0;
  iVar8 = 0;
  for (; (iVar8 < 0x20 && (first_field < this->descriptor_->field_count_));
      first_field = first_field + 1) {
    pFVar4 = Descriptor::field(this->descriptor_,first_field);
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,pFVar4);
    iVar2 = (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[6])(pIVar5);
    pFVar4 = Descriptor::field(this->descriptor_,first_field);
    bVar1 = IsRealOneof(pFVar4);
    if (!bVar1) {
      pFVar4 = Descriptor::field(this->descriptor_,first_field);
      bVar1 = anon_unknown_16::BitfieldTracksMutability(pFVar4);
      if (!bVar1) {
        iVar3 = (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[6])(pIVar5);
        if (iVar3 != 0) {
          iVar3 = (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar5);
          if (0 < iVar3) {
            iVar3 = (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar5);
            to_bitfield = iVar3 / 0x20;
            sVar6 = absl::lts_20250127::container_internal::
                    btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    ::count<int>((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                                  *)&declared_to_bitfields,&to_bitfield);
            if (sVar6 == 0) {
              GetBitFieldName_abi_cxx11_
                        ((string *)&local_80,(java *)((ulong)_to_bitfield & 0xffffffff),index_00);
              text_00._M_str = "int to_$bit_field_name$ = 0;\n";
              text_00._M_len = 0x1d;
              io::Printer::Print<char[15],std::__cxx11::string>
                        (printer,text_00,(char (*) [15])"bit_field_name",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_80);
              std::__cxx11::string::~string((string *)&local_80);
              absl::lts_20250127::container_internal::
              btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
              ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
                        *)&local_80,
                       &declared_to_bitfields.
                        super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                       ,&to_bitfield);
            }
          }
          (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar5,printer);
        }
      }
    }
    iVar8 = iVar8 + iVar2;
  }
  iVar9 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   *)&declared_to_bitfields);
  _to_bitfield = (pointer)iVar9.node_;
  local_c0 = iVar9.position_;
  iVar9 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)&declared_to_bitfields);
  local_50._M_dataplus._M_p = (pointer)iVar9.node_;
  local_50._M_string_length._0_4_ = iVar9.position_;
  while( true ) {
    bVar1 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                          *)&to_bitfield,(iterator *)&local_50);
    if (!bVar1) break;
    puVar7 = (uint *)absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                     ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                                  *)&to_bitfield);
    GetBitFieldName_abi_cxx11_((string *)&local_80,(java *)(ulong)*puVar7,index_01);
    text_01._M_str = "result.$bit_field_name$ |= to_$bit_field_name$;\n";
    text_01._M_len = 0x30;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_01,(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                 *)&to_bitfield);
  }
  io::Printer::Outdent(printer);
  text_02._M_str = "}\n\n";
  text_02._M_len = 3;
  io::Printer::Print<>(printer,text_02);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  ::~btree((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            *)&declared_to_bitfields);
  return first_field;
}

Assistant:

int MessageBuilderGenerator::GenerateBuildPartialPiece(io::Printer* printer,
                                                       int piece,
                                                       int first_field) {
  printer->Print(
      "private void buildPartial$piece$($classname$ result) {\n"
      "  int from_$bit_field_name$ = $bit_field_name$;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_), "piece",
      absl::StrCat(piece), "bit_field_name", GetBitFieldName(piece));
  printer->Indent();
  absl::btree_set<int> declared_to_bitfields;

  int bit = 0;
  int next = first_field;
  for (; bit < 32 && next < descriptor_->field_count(); ++next) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(next));
    bit += field.GetNumBitsForBuilder();

    // Skip oneof fields that are handled separately
    if (IsRealOneof(descriptor_->field(next))) {
      continue;
    }

    // Skip repeated fields because they are currently handled
    // in separate buildPartial sub-methods.
    if (BitfieldTracksMutability(descriptor_->field(next))) {
      continue;
    }
    // Skip fields without presence bits in the builder
    if (field.GetNumBitsForBuilder() == 0) {
      continue;
    }

    // Track message bits if necessary
    if (field.GetNumBitsForMessage() > 0) {
      int to_bitfield = field.GetMessageBitIndex() / 32;
      if (declared_to_bitfields.count(to_bitfield) == 0) {
        printer->Print("int to_$bit_field_name$ = 0;\n", "bit_field_name",
                       GetBitFieldName(to_bitfield));
        declared_to_bitfields.insert(to_bitfield);
      }
    }

    // Copy the field from the builder to the message
    field.GenerateBuildingCode(printer);
  }

  // Copy the bit field results to the generated message
  for (int to_bitfield : declared_to_bitfields) {
    printer->Print("result.$bit_field_name$ |= to_$bit_field_name$;\n",
                   "bit_field_name", GetBitFieldName(to_bitfield));
  }

  printer->Outdent();
  printer->Print("}\n\n");

  return next;
}